

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O3

void __thiscall
phoenix_flm_t::phoenix_flm_t
          (phoenix_flm_t *this,kstream *p__io,kstruct *p__parent,phoenix_flm_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__phoenix_flm_t_002b2150;
  (this->m_signature)._M_dataplus._M_p = (pointer)&(this->m_signature).field_2;
  (this->m_signature)._M_string_length = 0;
  (this->m_signature).field_2._M_local_buf[0] = '\0';
  (this->m_entries)._M_t.
  super___uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>
        *)0x0;
  this->m__parent = p__parent;
  this->m__root = this;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
           *)&this->m_entries,(pointer)0x0);
  this->f_len_flm_store_header = false;
  this->f_len_flm_entry = false;
  _read(this);
  return;
}

Assistant:

phoenix_flm_t::phoenix_flm_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, phoenix_flm_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    m_entries = nullptr;
    f_len_flm_store_header = false;
    f_len_flm_entry = false;
    _read();
}